

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_detour.c
# Opt level: O2

char * funchook_detour_print_info(void)

{
  return 
  "FuncHook Detour Plugin 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n\n"
  ;
}

Assistant:

const char *funchook_detour_print_info(void)
{
	static const char funchook_detour_info[] =
		"FuncHook Detour Plugin " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef FUNCHOOK_DETOUR_STATIC_DEFINE
		"Compiled as static library type\n"
#else
		"Compiled as shared library type\n"
#endif

		"\n";

	return funchook_detour_info;
}